

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall AbstractContentContext::j(AbstractContentContext *this,int inLineJoinStyle)

{
  EStatusCode EVar1;
  allocator<char> local_39;
  string local_38;
  int local_14;
  AbstractContentContext *pAStack_10;
  int inLineJoinStyle_local;
  AbstractContentContext *this_local;
  
  local_14 = inLineJoinStyle;
  pAStack_10 = this;
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  PrimitiveObjectsWriter::WriteInteger(&this->mPrimitiveWriter,(long)local_14,eTokenSeparatorSpace);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"j",&local_39);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  EVar1 = GetCurrentStatusCode(this);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::j(int inLineJoinStyle)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteInteger(inLineJoinStyle);
	mPrimitiveWriter.WriteKeyword("j");
	return GetCurrentStatusCode();
}